

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O2

void __thiscall
ear::PolarPointSourcePanner::PolarPointSourcePanner
          (PolarPointSourcePanner *this,
          vector<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
          *regions,optional<int> numberOfChannels)

{
  pointer puVar1;
  int iVar2;
  int iVar3;
  reference_type piVar4;
  type local_20;
  
  (this->super_PointSourcePanner)._vptr_PointSourcePanner = (_func_int **)&PTR_handle_001ebb00;
  puVar1 = (regions->
           super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->_regions).
  super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (regions->
       super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->_regions).
  super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  (this->_regions).
  super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (regions->
       super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (regions->
  super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (regions->
  super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (regions->
  super__Vector_base<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>,_std::allocator<std::unique_ptr<ear::RegionHandler,_std::default_delete<ear::RegionHandler>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20 = numberOfChannels.super_type;
  if (((ulong)numberOfChannels.super_type & 1) == 0) {
    iVar3 = _numberOfRequiredChannels(this);
    this->_numberOfOutputChannels = iVar3;
  }
  else {
    piVar4 = boost::optional<int>::get((optional<int> *)&local_20);
    iVar3 = *piVar4;
    this->_numberOfOutputChannels = iVar3;
    iVar2 = _numberOfRequiredChannels(this);
    _assert_impl(iVar2 <= iVar3,"not enough output channels in PolarPointSourcePanner");
  }
  return;
}

Assistant:

PolarPointSourcePanner::PolarPointSourcePanner(
      std::vector<std::unique_ptr<RegionHandler>> regions,
      boost::optional<int> numberOfChannels)
      : _regions(std::move(regions)) {
    if (!numberOfChannels) {
      _numberOfOutputChannels = _numberOfRequiredChannels();
    } else {
      _numberOfOutputChannels = numberOfChannels.get();
      ear_assert(_numberOfOutputChannels >= _numberOfRequiredChannels(),
                 "not enough output channels in PolarPointSourcePanner");
    }
  }